

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

Expression * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::Slot::makeExpr(Slot *this,Module *module)

{
  Name name;
  size_t sVar1;
  Const *right;
  Binary *local_68;
  Type local_58;
  size_t local_50;
  char *local_48;
  Binary *local_40;
  Expression *getBase;
  anon_class_16_2_29deed5a makeIndex;
  Builder builder;
  Module *module_local;
  Slot *this_local;
  
  Builder::Builder((Builder *)&makeIndex.this,module);
  getBase = (Expression *)&makeIndex.this;
  makeIndex.builder = (Builder *)this;
  sVar1 = IString::size(&(this->global).super_IString);
  if (sVar1 == 0) {
    this_local = (Slot *)makeExpr::anon_class_16_2_29deed5a::operator()
                                   ((anon_class_16_2_29deed5a *)&getBase);
  }
  else {
    local_50 = (this->global).super_IString.str._M_len;
    local_48 = (this->global).super_IString.str._M_str;
    wasm::Type::Type(&local_58,i32);
    name.super_IString.str._M_str = local_48;
    name.super_IString.str._M_len = local_50;
    local_68 = (Binary *)Builder::makeGlobalGet((Builder *)&makeIndex.this,name,local_58);
    if (this->index != 0) {
      local_40 = local_68;
      right = makeExpr::anon_class_16_2_29deed5a::operator()((anon_class_16_2_29deed5a *)&getBase);
      local_68 = Builder::makeBinary((Builder *)&makeIndex.this,AddInt32,(Expression *)local_68,
                                     (Expression *)right);
    }
    this_local = (Slot *)local_68;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TableSlotManager::Slot::makeExpr(Module& module) {
  Builder builder(module);
  auto makeIndex = [&]() { return builder.makeConst(int32_t(index)); };
  if (global.size()) {
    Expression* getBase = builder.makeGlobalGet(global, Type::i32);
    return index == 0 ? getBase
                      : builder.makeBinary(AddInt32, getBase, makeIndex());
  } else {
    return makeIndex();
  }
}